

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

void run_test(string *expression,string *expected_value)

{
  int iVar1;
  ostream *poVar2;
  shared_ptr<SchemeObject> sVar3;
  shared_ptr<SchemeObject> actual_result;
  shared_ptr<SchemeObject> expected_result;
  string local_350 [32];
  string local_330 [32];
  istringstream in2;
  istringstream in1;
  
  run_test::test_num = run_test::test_num + 1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Test ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,run_test::test_num);
  std::operator<<(poVar2,": ");
  init_scheme();
  std::__cxx11::istringstream::istringstream((istringstream *)&in1);
  std::__cxx11::istringstream::istringstream((istringstream *)&in2);
  evaluate_string_in_global_context((string *)&expected_result);
  sVar3 = evaluate_string_in_global_context((string *)&actual_result);
  if (expected_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      actual_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    iVar1 = (*(expected_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_SchemeObject[6])
                      (expected_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&actual_result,
                       sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
    if ((char)iVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"FAILED\n");
      poVar2 = std::operator<<(poVar2,(string *)expression);
      poVar2 = std::operator<<(poVar2," != ");
      poVar2 = std::operator<<(poVar2,(string *)expected_value);
      poVar2 = std::operator<<(poVar2," [[ ");
      (*(actual_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_SchemeObject[2])(local_330);
      poVar2 = std::operator<<(poVar2,local_330);
      poVar2 = std::operator<<(poVar2," != ");
      (*(expected_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_SchemeObject[2])(local_350);
      poVar2 = std::operator<<(poVar2,local_350);
      poVar2 = std::operator<<(poVar2," ]]");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_350);
      std::__cxx11::string::~string(local_330);
      exit(1);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"OK");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&actual_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&expected_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in1);
  return;
}

Assistant:

static void run_test(const std::string &expression, const std::string &expected_value)
{
    static int test_num = 0;
    ++test_num;
    std::cout << "Test " << test_num << ": ";
    init_scheme();
    std::istringstream in1, in2;
    auto expected_result = evaluate_string_in_global_context(expected_value);
    auto actual_result = evaluate_string_in_global_context(expression);
    if(expected_result != actual_result && !expected_result->is_eq(actual_result))
    {
        std::cout << "FAILED\n" << expression << " != " << expected_value << " [[ " << actual_result->external_repr()
                  << " != " << expected_result->external_repr() << " ]]" << std::endl;
        exit(1);
    }
    std::cout << "OK" << std::endl;
}